

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Queries::CreationTest::iterate(CreationTest *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ContextType ctxType;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  uint local_398;
  uint local_394;
  GLuint i_2;
  GLuint j_1;
  uint local_210;
  uint local_20c;
  GLuint j;
  GLuint i_1;
  uint local_88;
  GLuint i;
  undefined8 uStack_78;
  GLuint queries_dsa [7] [2];
  int local_38 [2];
  GLuint queries_legacy [2];
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  CreationTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  queries_legacy[1] = (GLuint)glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,(ApiType)queries_legacy[1]);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  queries_legacy[0]._3_1_ =
       glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || ((bool)queries_legacy[0]._3_1_)) {
    queries_legacy[0]._2_1_ = 1;
    queries_legacy[0]._1_1_ = 0;
    local_38[0] = 0;
    local_38[1] = 0;
    queries_dsa[3][0] = 0;
    queries_dsa[3][1] = 0;
    queries_dsa[4][0] = 0;
    queries_dsa[4][1] = 0;
    queries_dsa[1][0] = 0;
    queries_dsa[1][1] = 0;
    queries_dsa[2][0] = 0;
    queries_dsa[2][1] = 0;
    uStack_78 = 0;
    queries_dsa[0][0] = 0;
    queries_dsa[0][1] = 0;
    queries_dsa[5][0] = 0;
    queries_dsa[5][1] = 0;
    (**(code **)(lVar6 + 0x6e0))(2,local_38);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGenQueries have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                    ,0x71);
    for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
      cVar2 = (**(code **)(lVar6 + 0xca0))(queries_legacy[(ulong)local_88 - 2]);
      if (cVar2 != '\0') {
        queries_legacy[0]._2_1_ = 0;
        pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&j,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&j,
                            (char (*) [75])
                            "GenQueries has created default objects, but it should create only a names."
                           );
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&j);
      }
    }
    for (local_20c = 0; local_20c < 7; local_20c = local_20c + 1) {
      (**(code **)(lVar6 + 0x3d8))
                (iterate::targets[local_20c],2,queries_dsa + ((ulong)local_20c - 1));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glCreateQueries have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                      ,0x85);
      for (local_210 = 0; local_210 < 2; local_210 = local_210 + 1) {
        cVar2 = (**(code **)(lVar6 + 0xca0))(queries_dsa[(ulong)local_20c - 1][local_210]);
        if (cVar2 == '\0') {
          queries_legacy[0]._2_1_ = 0;
          pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar8 = tcu::TestContext::getLog(pTVar7);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&i_2,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&i_2,
                              (char (*) [47])"CreateQueries has not created default objects.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i_2);
        }
      }
    }
    for (local_394 = 0; local_394 < 2; local_394 = local_394 + 1) {
      if (queries_legacy[(ulong)local_394 - 2] != 0) {
        (**(code **)(lVar6 + 0x458))(1);
        queries_legacy[(ulong)local_394 - 2] = 0;
      }
      for (local_398 = 0; local_398 < 7; local_398 = local_398 + 1) {
        if (queries_dsa[(ulong)local_398 - 1][local_394] != 0) {
          (**(code **)(lVar6 + 0x458))(1);
          queries_dsa[(ulong)local_398 - 1][local_394] = 0;
        }
      }
    }
    if ((queries_legacy[0]._2_1_ & 1) == 0) {
      if ((queries_legacy[0]._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Query targets */
	static const glw::GLenum targets[] = {
		GL_SAMPLES_PASSED, GL_ANY_SAMPLES_PASSED,   GL_ANY_SAMPLES_PASSED_CONSERVATIVE,		 GL_TIME_ELAPSED,
		GL_TIMESTAMP,	  GL_PRIMITIVES_GENERATED, GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN
	};
	static const glw::GLuint targets_count = sizeof(targets) / sizeof(targets[0]);

	/* Queries objects */
	static const glw::GLuint queries_count = 2;

	glw::GLuint queries_legacy[queries_count]			  = {};
	glw::GLuint queries_dsa[targets_count][queries_count] = {};

	try
	{
		/* Check legacy state creation. */
		gl.genQueries(queries_count, queries_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries have failed");

		for (glw::GLuint i = 0; i < queries_count; ++i)
		{
			if (gl.isQuery(queries_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenQueries has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		for (glw::GLuint i = 0; i < targets_count; ++i)
		{
			gl.createQueries(targets[i], queries_count, queries_dsa[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

			for (glw::GLuint j = 0; j < queries_count; ++j)
			{
				if (!gl.isQuery(queries_dsa[i][j]))
				{
					is_ok = false;

					/* Log. */
					m_context.getTestContext().getLog() << tcu::TestLog::Message
														<< "CreateQueries has not created default objects."
														<< tcu::TestLog::EndMessage;
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint j = 0; j < queries_count; ++j)
	{
		if (queries_legacy[j])
		{
			gl.deleteQueries(1, &queries_legacy[j]);

			queries_legacy[j] = 0;
		}

		for (glw::GLuint i = 0; i < targets_count; ++i)
		{
			if (queries_dsa[i][j])
			{
				gl.deleteQueries(1, &queries_dsa[i][j]);

				queries_dsa[i][j] = 0;
			}
		}
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}